

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_has_side(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_BOOL *has_side)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  ulong uVar5;
  long lVar6;
  REF_INT RVar7;
  long lVar8;
  ulong uVar9;
  
  *has_side = 0;
  uVar5 = 0xffffffff;
  if (-1 < node0) {
    uVar5 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar5 != -1) {
    RVar7 = ref_cell->ref_adj->item[(int)uVar5].ref;
    do {
      if (0 < ref_cell->edge_per) {
        pRVar2 = ref_cell->e2n;
        pRVar3 = ref_cell->c2n;
        lVar8 = (long)RVar7 * (long)ref_cell->size_per;
        lVar6 = (long)(int)lVar8;
        uVar9 = 0;
        do {
          if (((pRVar3[pRVar2[uVar9 * 2] + lVar8] == node0) &&
              (pRVar3[pRVar2[uVar9 * 2 + 1] + lVar6] == node1)) ||
             ((pRVar3[pRVar2[uVar9 * 2] + lVar8] == node1 &&
              (pRVar3[pRVar2[uVar9 * 2 + 1] + lVar6] == node0)))) {
            *has_side = 1;
            return 0;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)ref_cell->edge_per != uVar9);
      }
      pRVar4 = ref_cell->ref_adj->item;
      iVar1 = pRVar4[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        RVar7 = -1;
      }
      else {
        RVar7 = pRVar4[uVar5].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_has_side(REF_CELL ref_cell, REF_INT node0,
                                     REF_INT node1, REF_BOOL *has_side) {
  REF_INT item, cell;
  REF_INT cell_edge;

  *has_side = REF_FALSE;

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), node0, item, cell)
      each_ref_cell_cell_edge(
          ref_cell,
          cell_edge) if ((node0 == ref_cell_e2n(ref_cell, 0, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 1, cell_edge, cell)) ||
                         (node0 == ref_cell_e2n(ref_cell, 1, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 0, cell_edge, cell))) {
    *has_side = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}